

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events.c
# Opt level: O0

void resize(mfb_window *window,int width,int height)

{
  uint in_EDX;
  uint in_ESI;
  mfb_window *in_RDI;
  char *window_title;
  uint32_t y;
  uint32_t x;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  char *pcVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  iVar2 = 0;
  pcVar1 = "";
  if (in_RDI != (mfb_window *)0x0) {
    pcVar1 = (char *)mfb_get_user_data(in_RDI);
  }
  fprintf(_stdout,"%s > resize: %d, %d\n",pcVar1,(ulong)in_ESI,(ulong)in_EDX);
  if (800 < (int)in_ESI) {
    iVar3 = (int)(in_ESI - 800) >> 1;
  }
  if (600 < (int)in_EDX) {
    iVar2 = (int)(in_EDX - 600) >> 1;
  }
  mfb_set_viewport((mfb_window *)CONCAT44(iVar3,iVar2),(uint)((ulong)pcVar1 >> 0x20),(uint)pcVar1,
                   in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void 
resize(struct mfb_window *window, int width, int height) {
    uint32_t x = 0;
    uint32_t y = 0;
    const char *window_title = "";
    if(window) {
        window_title = (const char *) mfb_get_user_data(window);
    }

    fprintf(stdout, "%s > resize: %d, %d\n", window_title, width, height);
    if(width > WIDTH) {
        x = (width - WIDTH) >> 1;
        width = WIDTH;
    }
    if(height > HEIGHT) {
        y = (height - HEIGHT) >> 1;
        height = HEIGHT;
    }
    mfb_set_viewport(window, x, y, width, height);
}